

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOfPdu.cpp
# Opt level: O3

void __thiscall DIS::IsPartOfPdu::IsPartOfPdu(IsPartOfPdu *this)

{
  EntityManagementFamilyPdu::EntityManagementFamilyPdu(&this->super_EntityManagementFamilyPdu);
  (this->super_EntityManagementFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IsPartOfPdu_001a0570;
  EntityID::EntityID(&this->_orginatingEntityID);
  EntityID::EntityID(&this->_receivingEntityID);
  Relationship::Relationship(&this->_relationship);
  Vector3Float::Vector3Float(&this->_partLocation);
  NamedLocation::NamedLocation(&this->_namedLocationID);
  EntityType::EntityType(&this->_partEntityType);
  Pdu::setPduType((Pdu *)this,'$');
  return;
}

Assistant:

IsPartOfPdu::IsPartOfPdu() : EntityManagementFamilyPdu(),
   _orginatingEntityID(), 
   _receivingEntityID(), 
   _relationship(), 
   _partLocation(), 
   _namedLocationID(), 
   _partEntityType()
{
    setPduType( 36 );
}